

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::EndSection(BasicReporter *this,string *sectionName,Counts *assertions)

{
  size_t count;
  ulong uVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_f1;
  string local_f0;
  pluralise local_d0;
  undefined1 local_a8 [8];
  TextColour colour_1;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  TextColour colour;
  SpanInfo *sectionSpan;
  Counts *assertions_local;
  string *sectionName_local;
  BasicReporter *this_local;
  
  colour.m_impl =
       (ConsoleColourImpl *)
       std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
       ::back(&this->m_sectionSpans);
  if ((((reference)colour.m_impl)->emitted & 1U) != 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = std::operator<<((this->m_config).stream,"[End of section: \'");
      poVar2 = std::operator<<(poVar2,(string *)sectionName);
      std::operator<<(poVar2,"\' ");
      if (assertions->failed == 0) {
        TextColour::TextColour((TextColour *)local_a8,ResultSuccess);
        pcVar3 = "";
        if (1 < assertions->passed) {
          pcVar3 = "All ";
        }
        poVar2 = std::operator<<((this->m_config).stream,pcVar3);
        count = assertions->passed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"assertion",&local_f1);
        pluralise::pluralise(&local_d0,count,&local_f0);
        poVar2 = Catch::operator<<(poVar2,&local_d0);
        std::operator<<(poVar2," passed");
        pluralise::~pluralise(&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        TextColour::~TextColour((TextColour *)local_a8);
      }
      else {
        TextColour::TextColour((TextColour *)local_38,ResultError);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"assertion",&local_59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"All ",(allocator<char> *)((long)&colour_1.m_impl + 7));
        ReportCounts(this,&local_58,assertions,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)((long)&colour_1.m_impl + 7));
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator(&local_59);
        TextColour::~TextColour((TextColour *)local_38);
      }
      poVar2 = std::operator<<((this->m_config).stream,"]\n");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  pop_back(&this->m_sectionSpans);
  return;
}

Assistant:

virtual void EndSection( const std::string& sectionName, const Counts& assertions ) {

            SpanInfo& sectionSpan = m_sectionSpans.back();
            if( sectionSpan.emitted && !sectionSpan.name.empty() ) {
                m_config.stream << "[End of section: '" << sectionName << "' ";

                if( assertions.failed ) {
                    TextColour colour( TextColour::ResultError );
                    ReportCounts( "assertion", assertions);
                }
                else {
                    TextColour colour( TextColour::ResultSuccess );
                    m_config.stream   << ( assertions.passed > 1 ? "All " : "" )
                                        << pluralise( assertions.passed, "assertion" ) << " passed" ;
                }
                m_config.stream << "]\n" << std::endl;
            }
            m_sectionSpans.pop_back();
        }